

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

Result __thiscall wabt::OutputBuffer::WriteToFile(OutputBuffer *this,string_view filename)

{
  pointer __ptr;
  pointer puVar1;
  FILE *__s;
  size_t sVar2;
  Enum EVar3;
  size_t sVar4;
  allocator<char> local_41;
  string filename_str;
  string_view filename_local;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&filename_str,&filename_local,&local_41);
  __s = fopen(filename_str._M_dataplus._M_p,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"%s:%d: unable to open %s for writing\n",
            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
            0x8b,filename_str._M_dataplus._M_p);
LAB_00124e35:
    EVar3 = Error;
  }
  else {
    __ptr = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__ptr != puVar1) {
      sVar2 = fwrite(__ptr,1,(long)puVar1 - (long)__ptr,__s);
      sVar4 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (((long)sVar2 < 0) || (sVar2 != sVar4)) {
        fprintf(_stderr,"%s:%d: failed to write %zd bytes to %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc"
                ,0x97,sVar4,filename_str._M_dataplus._M_p);
        fclose(__s);
        goto LAB_00124e35;
      }
    }
    fclose(__s);
    EVar3 = Ok;
  }
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result OutputBuffer::WriteToFile(std::string_view filename) const {
  std::string filename_str(filename);
  FILE* file = fopen(filename_str.c_str(), "wb");
  if (!file) {
    ERROR("unable to open %s for writing\n", filename_str.c_str());
    return Result::Error;
  }

  if (data.empty()) {
    fclose(file);
    return Result::Ok;
  }

  ssize_t bytes = fwrite(data.data(), 1, data.size(), file);
  if (bytes < 0 || static_cast<size_t>(bytes) != data.size()) {
    ERROR("failed to write %" PRIzd " bytes to %s\n", data.size(),
          filename_str.c_str());
    fclose(file);
    return Result::Error;
  }

  fclose(file);
  return Result::Ok;
}